

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::scan
               (Scanner *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  Resume *pRVar2;
  StackSwitch *pSVar3;
  Expression **ppEVar4;
  AtomicNotify *pAVar5;
  ContBind *pCVar6;
  TryTable *pTVar7;
  GlobalSet *pGVar8;
  CallRef *pCVar9;
  StructGet *pSVar10;
  Call *pCVar11;
  AtomicCmpxchg *pAVar12;
  CallIndirect *pCVar13;
  Load *pLVar14;
  Try *pTVar15;
  Break *pBVar16;
  Switch *pSVar17;
  ArrayNew *pAVar18;
  Return *pRVar19;
  StructNew *pSVar20;
  SIMDLoad *pSVar21;
  Suspend *pSVar22;
  Store *pSVar23;
  Throw *pTVar24;
  MemoryCopy *pMVar25;
  ResumeThrow *pRVar26;
  TupleMake *pTVar27;
  StringNew *pSVar28;
  ArrayNewFixed *pAVar29;
  Expression **currp_00;
  Expression **currp_01;
  Expression **extraout_RDX;
  Expression **currp_02;
  Expression **extraout_RDX_00;
  Expression **extraout_RDX_01;
  Expression **extraout_RDX_02;
  Expression **currp_03;
  Name *currp_04;
  Expression **currp_05;
  Expression **currp_06;
  ulong uVar30;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
               ,0x103);
  case BlockId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar30 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pBVar1->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case IfId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitIf,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::If>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               (TaskFunc)&pMVar25->size,currp_02);
    goto LAB_0015d8e6;
  case LoopId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitLoop,currp);
    pGVar8 = (GlobalSet *)Expression::cast<wasm::Loop>(this);
    goto LAB_0015d4bf;
  case BreakId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitBreak,currp);
    pBVar16 = Expression::cast<wasm::Break>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               (TaskFunc)&pBVar16->condition,currp_01);
    ppEVar4 = &pBVar16->value;
    currp_03 = extraout_RDX;
    goto LAB_0015d3b9;
  case SwitchId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSwitch,currp)
    ;
    pSVar17 = Expression::cast<wasm::Switch>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pSVar17->condition);
    ppEVar4 = &pSVar17->value;
    currp_03 = extraout_RDX_00;
    goto LAB_0015d3b9;
  case CallId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitCall,currp);
    pCVar11 = Expression::cast<wasm::Call>(this);
    uVar30 = (ulong)(uint)(pCVar11->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar11->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case CallIndirectId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitCallIndirect,
               currp);
    pCVar13 = Expression::cast<wasm::CallIndirect>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pCVar13->target);
    uVar30 = (ulong)(uint)(pCVar13->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar13->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case LocalGetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitLocalGet,
               currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitLocalSet,
               currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_0015d717;
  case GlobalGetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitGlobalGet,
               currp);
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitGlobalSet,
               currp);
    pGVar8 = Expression::cast<wasm::GlobalSet>(this);
    goto LAB_0015d4bf;
  case LoadId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitLoad,currp);
    pLVar14 = Expression::cast<wasm::Load>(this);
    ppEVar4 = &pLVar14->ptr;
    goto LAB_0015d8fe;
  case StoreId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStore,currp);
    pSVar23 = Expression::cast<wasm::Store>(this);
    goto LAB_0015d6de;
  case ConstId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitUnary,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::Unary>(this);
    goto LAB_0015d717;
  case BinaryId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitBinary,currp)
    ;
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::Binary>(this);
    goto LAB_0015d680;
  case SelectId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSelect,currp)
    ;
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::Select>(this);
    goto LAB_0015d8d7;
  case DropId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitDrop,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::Drop>(this);
    goto LAB_0015d550;
  case ReturnId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitReturn,currp)
    ;
    pRVar19 = Expression::cast<wasm::Return>(this);
    ppEVar4 = &pRVar19->value;
    currp_03 = extraout_RDX_02;
    goto LAB_0015d3b9;
  case MemorySizeId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemorySize,
               currp);
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemoryGrow,
               currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_0015d550;
  case NopId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitUnreachable,
               currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicRMW,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_0015d75e;
  case AtomicCmpxchgId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicCmpxchg
               ,currp);
    pAVar12 = Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_0015d74f;
  case AtomicWaitId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicWait,
               currp);
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::AtomicWait>(this);
    goto LAB_0015d4df;
  case AtomicNotifyId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicNotify,
               currp);
    pAVar5 = Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_0015d680;
  case AtomicFenceId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicFence,
               currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDExtract,
               currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_0015d717;
  case SIMDReplaceId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDReplace,
               currp);
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::SIMDReplace>(this);
    currp_04 = &pAVar5->memory;
    goto LAB_0015d68e;
  case SIMDShuffleId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDShuffle,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_0015d8e6;
  case SIMDTernaryId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDTernary,
               currp);
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_0015d4df;
  case SIMDShiftId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDShift,
               currp);
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_0015d680;
  case SIMDLoadId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDLoad,
               currp);
    pSVar21 = Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_0015d61a;
  case SIMDLoadStoreLaneId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    pSVar23 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_0015d6de:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pSVar23->value);
    ppEVar4 = &pSVar23->ptr;
    goto LAB_0015d8fe;
  case MemoryInitId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemoryInit,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::MemoryInit>(this);
    goto LAB_0015d74f;
  case DataDropId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitDataDrop,
               currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemoryCopy,
               currp);
    pMVar25 = Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_0015d8d7;
  case MemoryFillId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemoryFill,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_0015d8d7;
  case PopId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefNull,currp
              );
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefIsNull,
               currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_0015d550;
  case RefFuncId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefFunc,currp
              );
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefEq,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::RefEq>(this);
    goto LAB_0015d8e6;
  case TableGetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableGet,
               currp);
    pGVar8 = (GlobalSet *)Expression::cast<wasm::TableGet>(this);
LAB_0015d4bf:
    ppEVar4 = &pGVar8->value;
    goto LAB_0015d8fe;
  case TableSetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableSet,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableSet>(this);
    goto LAB_0015d75e;
  case TableSizeId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableSize,
               currp);
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableGrow,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableGrow>(this);
    goto LAB_0015d75e;
  case TableFillId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableFill,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableFill>(this);
    goto LAB_0015d74f;
  case TableCopyId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableCopy,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::TableCopy>(this);
    goto LAB_0015d8d7;
  case TableInitId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableInit,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableInit>(this);
    goto LAB_0015d74f;
  case TryId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTry,currp);
    pTVar15 = Expression::cast<wasm::Try>(this);
    uVar30 = (ulong)(uint)(pTVar15->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar15->catchBodies).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar4);
    }
    ppEVar4 = &pTVar15->body;
    goto LAB_0015d8fe;
  case TryTableId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTryTable,
               currp);
    pTVar7 = Expression::cast<wasm::TryTable>(this);
    goto LAB_0015d550;
  case ThrowId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitThrow,currp);
    pTVar24 = Expression::cast<wasm::Throw>(this);
    uVar30 = (ulong)(uint)(pTVar24->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar24->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case RethrowId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRethrow,currp
              );
    Expression::cast<wasm::Rethrow>(this);
    return;
  case ThrowRefId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitThrowRef,
               currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ThrowRef>(this);
    goto LAB_0015d550;
  case TupleMakeId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTupleMake,
               currp);
    pTVar27 = Expression::cast<wasm::TupleMake>(this);
    uVar30 = (ulong)(uint)(pTVar27->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar27->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case TupleExtractId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTupleExtract,
               currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::TupleExtract>(this);
    goto LAB_0015d550;
  case RefI31Id:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefI31,currp)
    ;
    pTVar7 = (TryTable *)Expression::cast<wasm::RefI31>(this);
    goto LAB_0015d550;
  case I31GetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitI31Get,currp)
    ;
    pTVar7 = (TryTable *)Expression::cast<wasm::I31Get>(this);
    goto LAB_0015d550;
  case CallRefId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitCallRef,currp
              );
    pCVar9 = Expression::cast<wasm::CallRef>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pCVar9->target);
    uVar30 = (ulong)(uint)(pCVar9->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar9->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case RefTestId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefTest,currp
              );
    pTVar7 = (TryTable *)Expression::cast<wasm::RefTest>(this);
    goto LAB_0015d550;
  case RefCastId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefCast,currp
              );
    pTVar7 = (TryTable *)Expression::cast<wasm::RefCast>(this);
    goto LAB_0015d550;
  case BrOnId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitBrOn,currp);
    pSVar21 = (SIMDLoad *)Expression::cast<wasm::BrOn>(this);
LAB_0015d61a:
    ppEVar4 = &pSVar21->ptr;
    goto LAB_0015d8fe;
  case StructNewId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStructNew,
               currp);
    pSVar20 = Expression::cast<wasm::StructNew>(this);
    uVar30 = (ulong)(uint)(pSVar20->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar20->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case StructGetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStructGet,
               currp);
    pSVar10 = Expression::cast<wasm::StructGet>(this);
    goto LAB_0015d717;
  case StructSetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStructSet,
               currp);
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::StructSet>(this);
    goto LAB_0015d680;
  case StructRMWId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStructRMW,
               currp);
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::StructRMW>(this);
    goto LAB_0015d680;
  case StructCmpxchgId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStructCmpxchg
               ,currp);
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::StructCmpxchg>(this);
LAB_0015d4df:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&pAVar5->memory);
    currp_04 = (Name *)&pAVar5->notifyCount;
    goto LAB_0015d68e;
  case ArrayNewId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayNew,
               currp);
    pAVar18 = Expression::cast<wasm::ArrayNew>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pAVar18->size);
    ppEVar4 = &pAVar18->init;
    currp_03 = extraout_RDX_01;
LAB_0015d3b9:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               (TaskFunc)ppEVar4,currp_03);
    return;
  case ArrayNewDataId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayNewData,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewData>(this);
    goto LAB_0015d75e;
  case ArrayNewElemId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayNewElem,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewElem>(this);
    goto LAB_0015d75e;
  case ArrayNewFixedId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayNewFixed
               ,currp);
    pAVar29 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar30 = (ulong)(uint)(pAVar29->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pAVar29->values).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case ArrayGetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayGet,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_0015d8e6;
  case ArraySetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArraySet,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_0015d8d7;
  case ArrayLenId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayLen,
               currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_0015d550;
  case ArrayCopyId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayCopy,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&(pMVar25->destMemory).super_IString.str._M_str);
    goto LAB_0015d8c8;
  case ArrayFillId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayFill,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayFill>(this);
LAB_0015d8c8:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&pMVar25->destMemory);
    goto LAB_0015d8d7;
  case ArrayInitDataId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayInitData
               ,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitData>(this);
    goto LAB_0015d04f;
  case ArrayInitElemId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayInitElem
               ,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitElem>(this);
LAB_0015d04f:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&pAVar12->memory);
LAB_0015d74f:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pAVar12->replacement);
LAB_0015d75e:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pAVar12->expected);
    ppEVar4 = &pAVar12->ptr;
    goto LAB_0015d8fe;
  case RefAsId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefAs,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::RefAs>(this);
    goto LAB_0015d717;
  case StringNewId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringNew,
               currp);
    pSVar28 = Expression::cast<wasm::StringNew>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               (TaskFunc)&pSVar28->end,currp_05);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               (TaskFunc)&pSVar28->start,currp_06);
    ppEVar4 = &pSVar28->ref;
    goto LAB_0015d8fe;
  case StringConstId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringConst,
               currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringMeasure
               ,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::StringMeasure>(this);
LAB_0015d717:
    ppEVar4 = &pSVar10->ref;
    goto LAB_0015d8fe;
  case StringEncodeId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringEncode,
               currp);
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::StringEncode>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               (TaskFunc)&pAVar5->memory,currp_00);
    currp_04 = (Name *)&pAVar5->notifyCount;
    goto LAB_0015d68e;
  case StringConcatId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringConcat,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_0015d8e6;
  case StringEqId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringEq,
               currp);
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::StringEq>(this);
LAB_0015d680:
    currp_04 = (Name *)&pAVar5->notifyCount;
LAB_0015d68e:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)currp_04);
    ppEVar4 = &pAVar5->ptr;
    goto LAB_0015d8fe;
  case StringWTF16GetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitStringWTF16Get,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_0015d8e6;
  case StringSliceWTFId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitStringSliceWTF,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_0015d8d7:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pMVar25->size);
LAB_0015d8e6:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pMVar25->source);
    ppEVar4 = &pMVar25->dest;
    goto LAB_0015d8fe;
  case ContNewId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitContNew,currp
              );
    pTVar7 = (TryTable *)Expression::cast<wasm::ContNew>(this);
LAB_0015d550:
    ppEVar4 = &pTVar7->body;
LAB_0015d8fe:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,ppEVar4)
    ;
    return;
  case ContBindId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitContBind,
               currp);
    pCVar6 = Expression::cast<wasm::ContBind>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)(pCVar6 + 0x30));
    uVar30 = (ulong)*(uint *)(pCVar6 + 0x18);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar6 + 0x10),uVar30);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case SuspendId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSuspend,currp
              );
    pSVar22 = Expression::cast<wasm::Suspend>(this);
    uVar30 = (ulong)*(uint *)(pSVar22 + 0x28);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar22 + 0x20),uVar30);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case ResumeId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitResume,currp)
    ;
    pRVar2 = Expression::cast<wasm::Resume>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)(pRVar2 + 0x70));
    uVar30 = (ulong)*(uint *)(pRVar2 + 0x58);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pRVar2 + 0x50),uVar30);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case ResumeThrowId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitResumeThrow,
               currp);
    pRVar26 = Expression::cast<wasm::ResumeThrow>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)(pRVar26 + 0x80));
    uVar30 = (ulong)*(uint *)(pRVar26 + 0x68);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pRVar26 + 0x60),uVar30);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case StackSwitchId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStackSwitch,
               currp);
    pSVar3 = Expression::cast<wasm::StackSwitch>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)(pSVar3 + 0x40));
    uVar30 = (ulong)*(uint *)(pSVar3 + 0x28);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar3 + 0x20),uVar30);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }